

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

void __thiscall
clipp::detail::
formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::write_spaces(formatting_ostream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,int n)

{
  ostream *poVar1;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (0 < n) {
    poVar1 = (ostream *)this->os_;
    local_48 = local_38;
    std::__cxx11::string::_M_construct((ulong)&local_48,(char)n);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_48,local_40);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    this->curCol_ = this->curCol_ + n;
  }
  return;
}

Assistant:

void write_spaces(int n) {
        if(n < 1) return;
        os_ << string_type(size_type(n), ' ');
        curCol_ += n;
    }